

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser.cpp
# Opt level: O2

void __thiscall QHttpHeaderParser::clear(QHttpHeaderParser *this)

{
  this->statusCode = 100;
  this->majorVersion = 0;
  this->minorVersion = 0;
  QString::clear(&this->reasonPhrase);
  QHttpHeaders::clear(&this->fields);
  return;
}

Assistant:

void QHttpHeaderParser::clear()
{
    statusCode = 100;
    majorVersion = 0;
    minorVersion = 0;
    reasonPhrase.clear();
    fields.clear();
}